

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_vumeter.c
# Opt level: O3

void vu_check_height(t_vu *x,int h)

{
  int iVar1;
  
  iVar1 = 2;
  if (2 < h / 0x28) {
    iVar1 = h / 0x28;
  }
  x->x_led_size = iVar1 + -1;
  (x->x_gui).x_h = iVar1 * ((x->x_gui).x_glist)->gl_zoom * 0x28;
  return;
}

Assistant:

void vu_check_height(t_vu *x, int h)
{
    int n;

    n = h / IEM_VU_STEPS;
    if(n < IEM_VU_MINSIZE)
        n = IEM_VU_MINSIZE;
    x->x_led_size = n - 1;
    x->x_gui.x_h = (IEM_VU_STEPS * n) * IEMGUI_ZOOM(x);
}